

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall CProficiencies::DisplayProfsForStat(CProficiencies *this,CHAR_DATA *imm)

{
  pointer ppVar1;
  char *pcVar2;
  long lVar3;
  int *piVar4;
  char buf [4608];
  char buf2 [4608];
  
  sprintf(buf,"Proficiencies (%d pts left): ",(ulong)(uint)this->points);
  piVar4 = this->profs;
  ppVar1 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar3 = 8; *(long *)((long)&ppVar1->ppsn + lVar3) != 0; lVar3 = lVar3 + 0x28) {
    if (*piVar4 != -1) {
      sprintf(buf2,"%s (%d) ");
      strcat(buf,buf2);
      ppVar1 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    piVar4 = piVar4 + 1;
  }
  pcVar2 = palloc_string(buf);
  pcVar2 = format_string(pcVar2);
  send_to_char(pcVar2,imm);
  free_pstring(pcVar2);
  return;
}

Assistant:

void CProficiencies::DisplayProfsForStat(CHAR_DATA *imm)
{
	// auto points = GetPoints();
	// auto buffer = fmt::format("Proficiencies ({} pts left): \n\r", points);

	// auto prof_table_size = std::size(prof_table);
	// for (auto i = 0; i < prof_table_size; i++)
	// {
	// 	if (profs[i] == -1)
	// 		continue;

	// 	buffer += fmt::format("{} ({}) \n\r", prof_table[i].name, profs[i]);
	// }

	// buffer = std::string(format_string(buffer.data()));
	// send_to_char(buffer.c_str(), imm);

	// TODO: the above code causes a double free error, so using the old code for now
	// boo format_string(char*) boo!!!

	char buf[MSL], buf2[MSL];
	int i;
	sprintf(buf, "Proficiencies (%d pts left): ", GetPoints());
	for(i = 0; prof_table[i].name != nullptr; i++)
	{
		if(profs[i] == -1)
			continue;
		sprintf(buf2,"%s (%d) ", prof_table[i].name, profs[i]);
		strcat(buf, buf2);
	}
	char *fbuf = palloc_string(buf);
	fbuf = format_string(fbuf);
	send_to_char(fbuf, imm);
	free_pstring(fbuf);
}